

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<double>::RepeatedField
          (RepeatedField<double> *this,RepeatedField<double> *other)

{
  LogMessage *pLVar1;
  double *__dest;
  double *__src;
  LogFinisher local_91;
  LogMessage local_90;
  LogMessage local_58;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  if (other->current_size_ != 0) {
    Reserve(this,other->current_size_);
    AddNAlreadyReserved(this,other->current_size_);
    if (this->current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x295);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar1);
      internal::LogMessage::~LogMessage(&local_58);
    }
    __dest = elements(this);
    if (other->current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_90,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_91,pLVar1);
      internal::LogMessage::~LogMessage(&local_90);
    }
    __src = elements(other);
    memcpy(__dest,__src,(long)other->current_size_ << 3);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}